

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O1

void __thiscall binpac::FlowBuffer::DiscardData(FlowBuffer *this)

{
  this->mode_ = CR_OR_LF_0;
  this->message_complete_ = false;
  this->have_pending_request_ = false;
  this->buffer_n_ = 0;
  this->frame_length_ = 0;
  this->orig_data_begin_ = (const_byteptr)0x0;
  this->orig_data_end_ = (const_byteptr)0x0;
  ContractBuffer(this);
  return;
}

Assistant:

void FlowBuffer::DiscardData()
	{
	mode_ = UNKNOWN_MODE;
	message_complete_ = false;
	have_pending_request_ = false;
	orig_data_begin_ = orig_data_end_ = nullptr;

	buffer_n_ = 0;
	frame_length_ = 0;
	ContractBuffer();
	}